

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

SetUpTearDownSuiteFuncType
testing::internal::SuiteApiResolver<solitaire::SolitaireHandWithOneCardTest>::GetTearDownCaseOrSuite
          (char *filename,int line_num)

{
  bool bVar1;
  ostream *poVar2;
  GTestLog local_14;
  
  bVar1 = IsTrue(true);
  if (!bVar1) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/externalLibs/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x226);
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "Condition !test_case_fp || !test_suite_fp failed. ");
    poVar2 = std::operator<<(poVar2,
                             "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                            );
    poVar2 = std::operator<<(poVar2,filename);
    poVar2 = std::operator<<(poVar2,":");
    std::ostream::operator<<(poVar2,line_num);
    GTestLog::~GTestLog(&local_14);
  }
  return (SetUpTearDownSuiteFuncType)0x0;
}

Assistant:

static SetUpTearDownSuiteFuncType GetTearDownCaseOrSuite(const char* filename,
                                                           int line_num) {
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
    SetUpTearDownSuiteFuncType test_case_fp =
        GetNotDefaultOrNull(&T::TearDownTestCase, &Test::TearDownTestCase);
    SetUpTearDownSuiteFuncType test_suite_fp =
        GetNotDefaultOrNull(&T::TearDownTestSuite, &Test::TearDownTestSuite);

    GTEST_CHECK_(!test_case_fp || !test_suite_fp)
        << "Test can not provide both TearDownTestSuite and TearDownTestCase,"
           " please make sure there is only one present at"
        << filename << ":" << line_num;

    return test_case_fp != nullptr ? test_case_fp : test_suite_fp;
#else
    (void)(filename);
    (void)(line_num);
    return &T::TearDownTestSuite;
#endif
  }